

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagonalMatrix.h
# Opt level: O2

DiagonalMatrix<60,_50> * __thiscall
singular::DiagonalMatrix<60,_50>::operator=
          (DiagonalMatrix<60,_50> *this,DiagonalMatrix<60,_50> *copyee)

{
  release(this);
  this->pBlock = copyee->pBlock;
  copyee->pBlock = (double *)0x0;
  return this;
}

Assistant:

DiagonalMatrix& operator =(DiagonalMatrix&& copyee) {
#else
		DiagonalMatrix& operator =(const DiagonalMatrix& copyee) {
#endif
			this->release();
			this->pBlock = copyee.pBlock;
#if SINGULAR_RVALUE_REFERENCE_SUPPORTED
			copyee.pBlock = nullptr;
#else
			const_cast< DiagonalMatrix& >(copyee).pBlock = nullptr;
#endif
			return *this;
		}

		/**
		 * Returns a clone of this matrix.
		 *
		 * @return
		 *     Clone of this matrix.
		 */
		inline DiagonalMatrix clone() const {
			return DiagonalMatrix(this->pBlock);
		}

		/**
		 * Returns the element at a given row and column.
		 *
		 * The behavior is undefined,
		 *  - if `i < 0` or `i >= M`,
		 *  - or if `j < 0` or `j >= N`
		 *
		 * @param i
		 *     Index of the row to be obtained.
		 * @param j
		 *     Index of the column to be obtained.
		 * @return
		 *     Element at the ith row and jth column.
		 *     0 if `i != j`.
		 */
		double operator ()(int i, int j) const {
			assert(i >= 0 && i < M);
			assert(j >= 0 && j < N);
			if (i == j) {
				return this->pBlock[i];
			} else {
				return 0.0;
			}
		}

		/**
		 * Transposes this matrix.
		 *
		 * @return
		 *     Transposed matrix.
		 */
		DiagonalMatrix< N, M > transpose() const {
			return DiagonalMatrix< N, M >(this->pBlock);
		}
	private:
#if SINGULAR_FUNCTION_DELETION_SUPPORTED
		/** Copy constructor is not allowed. */
		DiagonalMatrix(const DiagonalMatrix& copyee) = delete;

		/** Copy assignment is not allowed. */
		DiagonalMatrix& operator =(const DiagonalMatrix& copyee) = delete;
#elif SINGULAR_RVALUE_REFERENCE_SUPPORTED
		/** Copy constructor is not allowed. */
		DiagonalMatrix(const DiagonalMatrix& copyee) {}

		/** Copy assignment is not allowed. */
		DiagonalMatrix& operator =(const DiagonalMatrix& copyee) {
			return *this;
		}
#endif

		/**
		 * Releases the memory block of this matrix.
		 * Has no effect if the memory block has already been released.
		 */
		inline void release() {
			delete[] this->pBlock;
			this->pBlock = nullptr;
		}
	}